

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int archive_read_format_iso9660_cleanup(archive_read *a)

{
  void *__ptr;
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *__ptr_00;
  void *__ptr_01;
  int iVar3;
  int iVar4;
  
  __ptr = a->format->data;
  __ptr_00 = *(undefined8 **)((long)__ptr + 0x68);
  while (__ptr_00 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*__ptr_00;
    archive_string_free((archive_string *)(__ptr_00 + 0x15));
    archive_string_free((archive_string *)(__ptr_00 + 0x1b));
    free((void *)__ptr_00[0x18]);
    __ptr_01 = (void *)__ptr_00[0x22];
    while (__ptr_01 != (void *)0x0) {
      pvVar2 = *(void **)((long)__ptr_01 + 0x10);
      free(__ptr_01);
      __ptr_01 = pvVar2;
    }
    free(__ptr_00);
    __ptr_00 = puVar1;
  }
  free(*(void **)((long)__ptr + 0x38));
  archive_string_free((archive_string *)((long)__ptr + 0x10));
  archive_string_free((archive_string *)((long)__ptr + 0x50));
  if (*(void **)((long)__ptr + 0x70) != (void *)0x0) {
    free(*(void **)((long)__ptr + 0x70));
  }
  free(*(void **)((long)__ptr + 0x100));
  free(*(void **)((long)__ptr + 0x138));
  iVar4 = 0;
  if ((*(int *)((long)__ptr + 0x1d8) != 0) &&
     (iVar3 = cm_zlib_inflateEnd((z_streamp)((long)__ptr + 0x168)), iVar4 = 0, iVar3 != 0)) {
    archive_set_error(&a->archive,-1,"Failed to clean up zlib decompressor");
    iVar4 = -0x1e;
  }
  free(*(void **)((long)__ptr + 0x1f0));
  free(*(void **)((long)__ptr + 0x200));
  free(__ptr);
  a->format->data = (void *)0x0;
  return iVar4;
}

Assistant:

static int
archive_read_format_iso9660_cleanup(struct archive_read *a)
{
	struct iso9660 *iso9660;
	int r = ARCHIVE_OK;

	iso9660 = (struct iso9660 *)(a->format->data);
	release_files(iso9660);
	free(iso9660->read_ce_req.reqs);
	archive_string_free(&iso9660->pathname);
	archive_string_free(&iso9660->previous_pathname);
	if (iso9660->pending_files.files)
		free(iso9660->pending_files.files);
#ifdef HAVE_ZLIB_H
	free(iso9660->entry_zisofs.uncompressed_buffer);
	free(iso9660->entry_zisofs.block_pointers);
	if (iso9660->entry_zisofs.stream_valid) {
		if (inflateEnd(&iso9660->entry_zisofs.stream) != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Failed to clean up zlib decompressor");
			r = ARCHIVE_FATAL;
		}
	}
#endif
	free(iso9660->utf16be_path);
	free(iso9660->utf16be_previous_path);
	free(iso9660);
	(a->format->data) = NULL;
	return (r);
}